

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Fts5TermsetAdd(Fts5Termset *p,int iIdx,char *pTerm,int nTerm,int *pbPresent)

{
  int iVar1;
  ulong uVar2;
  Fts5TermsetEntry *pFVar3;
  uint uVar4;
  size_t __n;
  int rc;
  int local_44;
  Fts5Termset *local_40;
  int *local_38;
  
  local_44 = 0;
  *pbPresent = 0;
  if (p != (Fts5Termset *)0x0) {
    if (nTerm < 1) {
      uVar4 = 0xd;
    }
    else {
      uVar2 = (ulong)(uint)nTerm + 1;
      uVar4 = 0xd;
      do {
        uVar4 = uVar4 * 8 ^ uVar4 ^ (int)pTerm[uVar2 - 2];
        uVar2 = uVar2 - 1;
      } while (1 < uVar2);
    }
    uVar4 = (uVar4 << 3 ^ iIdx ^ uVar4) & 0x1ff;
    __n = (size_t)nTerm;
    local_40 = p;
    local_38 = pbPresent;
    for (pFVar3 = p->apHash[uVar4]; pFVar3 != (Fts5TermsetEntry *)0x0; pFVar3 = pFVar3->pNext) {
      if (((pFVar3->iIdx == iIdx) && (pFVar3->nTerm == nTerm)) &&
         (iVar1 = bcmp(pFVar3->pTerm,pTerm,__n), iVar1 == 0)) {
        *local_38 = 1;
        return local_44;
      }
    }
    pFVar3 = (Fts5TermsetEntry *)sqlite3Fts5MallocZero(&local_44,__n + 0x18);
    if (pFVar3 != (Fts5TermsetEntry *)0x0) {
      pFVar3->pTerm = (char *)(pFVar3 + 1);
      pFVar3->nTerm = nTerm;
      pFVar3->iIdx = iIdx;
      memcpy(pFVar3 + 1,pTerm,__n);
      pFVar3->pNext = local_40->apHash[uVar4];
      local_40->apHash[uVar4] = pFVar3;
    }
  }
  return local_44;
}

Assistant:

static int sqlite3Fts5TermsetAdd(
  Fts5Termset *p, 
  int iIdx,
  const char *pTerm, int nTerm, 
  int *pbPresent
){
  int rc = SQLITE_OK;
  *pbPresent = 0;
  if( p ){
    int i;
    u32 hash = 13;
    Fts5TermsetEntry *pEntry;

    /* Calculate a hash value for this term. This is the same hash checksum
    ** used by the fts5_hash.c module. This is not important for correct
    ** operation of the module, but is necessary to ensure that some tests
    ** designed to produce hash table collisions really do work.  */
    for(i=nTerm-1; i>=0; i--){
      hash = (hash << 3) ^ hash ^ pTerm[i];
    }
    hash = (hash << 3) ^ hash ^ iIdx;
    hash = hash % ArraySize(p->apHash);

    for(pEntry=p->apHash[hash]; pEntry; pEntry=pEntry->pNext){
      if( pEntry->iIdx==iIdx 
          && pEntry->nTerm==nTerm 
          && memcmp(pEntry->pTerm, pTerm, nTerm)==0 
      ){
        *pbPresent = 1;
        break;
      }
    }

    if( pEntry==0 ){
      pEntry = sqlite3Fts5MallocZero(&rc, sizeof(Fts5TermsetEntry) + nTerm);
      if( pEntry ){
        pEntry->pTerm = (char*)&pEntry[1];
        pEntry->nTerm = nTerm;
        pEntry->iIdx = iIdx;
        memcpy(pEntry->pTerm, pTerm, nTerm);
        pEntry->pNext = p->apHash[hash];
        p->apHash[hash] = pEntry;
      }
    }
  }

  return rc;
}